

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O2

void dsc_xor_group(Dsc_node_t *pOut,Dsc_node_t *ni,Dsc_node_t *nj,int nVars,int TRUTH_WORDS)

{
  uint *cubeCof;
  uint *cubeCof_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  word *pwVar5;
  uint uVar6;
  uint *cubeCof_01;
  uint uVar7;
  Dsc_node_t *pDVar8;
  uint *cubeCof_02;
  uint *puVar9;
  uint *pIn;
  
  cubeCof_01 = ni->off;
  cubeCof = ni->on;
  cubeCof_00 = nj->off;
  cubeCof_02 = nj->on;
  uVar1 = ni->on[0];
  uVar2 = ni->off[0];
  uVar3 = nj->on[0];
  uVar4 = nj->off[0];
  concat(pOut->exp,'[',']',ni->exp,1,nj->exp,1);
  uVar7 = uVar1;
  if ((int)uVar2 < (int)uVar1) {
    uVar7 = uVar2;
  }
  uVar6 = uVar7;
  if ((int)uVar4 <= (int)uVar7) {
    uVar6 = uVar4;
  }
  pDVar8 = nj;
  if ((int)uVar7 <= (int)uVar4) {
    pDVar8 = ni;
  }
  if ((int)uVar3 < (int)uVar6) {
    pDVar8 = nj;
  }
  if (pDVar8 == ni) {
    if ((int)uVar3 < (int)uVar6 || (int)uVar7 <= (int)uVar4 && (int)uVar1 < (int)uVar2) {
      pwVar5 = nj->pPosCof;
      pOut->pNegCof = pwVar5;
      cubeCofactor(pwVar5,cubeCof,TRUTH_WORDS);
      puVar9 = cubeCof;
    }
    else {
      pwVar5 = nj->pNegCof;
      pOut->pNegCof = pwVar5;
      cubeCofactor(pwVar5,cubeCof_01,TRUTH_WORDS);
      nj = (Dsc_node_t *)&nj->pPosCof;
      puVar9 = cubeCof_01;
    }
  }
  else if ((int)uVar3 < (int)uVar6 || (int)uVar7 <= (int)uVar4 && (int)uVar1 < (int)uVar2) {
    pwVar5 = ni->pPosCof;
    pOut->pNegCof = pwVar5;
    cubeCofactor(pwVar5,cubeCof_02,TRUTH_WORDS);
    nj = ni;
    puVar9 = cubeCof_02;
  }
  else {
    pwVar5 = ni->pNegCof;
    pOut->pNegCof = pwVar5;
    cubeCofactor(pwVar5,cubeCof_00,TRUTH_WORDS);
    nj = (Dsc_node_t *)&ni->pPosCof;
    puVar9 = cubeCof_00;
  }
  pwVar5 = nj->pNegCof;
  pOut->pPosCof = pwVar5;
  cubeCofactor(pwVar5,puVar9,TRUTH_WORDS);
  pOut->pBoolDiff = ni->pBoolDiff;
  pOut->off[0] = 0;
  puVar9 = cubeCof_01;
  if ((int)(uVar1 + uVar3) < (int)(uVar2 + uVar4)) {
    puVar9 = cubeCof;
  }
  pIn = cubeCof_00;
  if ((int)(uVar1 + uVar3) < (int)(uVar2 + uVar4)) {
    pIn = cubeCof_02;
  }
  merge(pOut->off,puVar9);
  merge(pOut->off,pIn);
  pOut->on[0] = 0;
  if ((int)(uVar4 + uVar1) < (int)(uVar3 + uVar2)) {
    cubeCof_02 = cubeCof_00;
    cubeCof_01 = cubeCof;
  }
  merge(pOut->on,cubeCof_01);
  merge(pOut->on,cubeCof_02);
  return;
}

Assistant:

void dsc_xor_group(Dsc_node_t * pOut, Dsc_node_t * ni, Dsc_node_t * nj, int nVars, const int TRUTH_WORDS) {
    //
    const unsigned int * xiOFF = ni->off;
    const unsigned int * xiON = ni->on;
    const unsigned int * xjOFF = nj->off;
    const unsigned int * xjON = nj->on;
    //
    const int xiOFFSize = xiOFF[0];
    const int xiONSize = xiON[0];
    const int xjOFFSize = xjOFF[0];
    const int xjONSize = xjON[0];
    // minCubeCofs
    int minCCSize = xiOFFSize;
    int minCCPolarity = 0;
    Dsc_node_t * minCCNode = ni;
    // expression
    concat(pOut->exp, '[', ']', ni->exp, 1, nj->exp, 1);
    if (minCCSize > xiONSize) {
        minCCSize = xiONSize;
        minCCPolarity = 1;
        //minCCNode = ni;
    }
    if (minCCSize > xjOFFSize) {
        minCCSize = xjOFFSize;
        minCCPolarity = 0;
        minCCNode = nj;
    }
    if (minCCSize > xjONSize) {
        minCCSize = xjONSize;
        minCCPolarity = 1;
        minCCNode = nj;
    }
    //
    if (minCCNode == ni) {
        if (minCCPolarity) {
            // gOFF = xiON, xjON
            pOut->pNegCof = nj->pPosCof;
            cubeCofactor(pOut->pNegCof, xiON, TRUTH_WORDS);
            // gON = xiON, xjOFF
            pOut->pPosCof = nj->pNegCof;
            cubeCofactor(pOut->pPosCof, xiON, TRUTH_WORDS);
        } else {
            // gOFF = xiOFF, xjOFF
            pOut->pNegCof = nj->pNegCof;
            cubeCofactor(pOut->pNegCof, xiOFF, TRUTH_WORDS);
            // gON = xiOFF, xjON
            pOut->pPosCof = nj->pPosCof;
            cubeCofactor(pOut->pPosCof, xiOFF, TRUTH_WORDS);
        }
    }else  {
        if (minCCPolarity) {
            // gOFF = xjON, xiON
            pOut->pNegCof = ni->pPosCof;
            cubeCofactor(pOut->pNegCof, xjON, TRUTH_WORDS);
            // gON = xjON, xiOFF
            pOut->pPosCof = ni->pNegCof;
            cubeCofactor(pOut->pPosCof, xjON, TRUTH_WORDS);
        } else {
            // gOFF = xjOFF, xiOFF
            pOut->pNegCof = ni->pNegCof;
            cubeCofactor(pOut->pNegCof, xjOFF, TRUTH_WORDS);
            // gON = xjOFF, xiON
            pOut->pPosCof = ni->pPosCof;
            cubeCofactor(pOut->pPosCof, xjOFF, TRUTH_WORDS);
        }
    }
    // bool diff
    pOut->pBoolDiff = ni->pBoolDiff;
    // evaluating specs
    // off spec
    pOut->off[0] = 0;
    if ((xiOFFSize+xjOFFSize) <= (xiONSize+xjONSize)) {
        merge(pOut->off, xiOFF);
        merge(pOut->off, xjOFF);
    } else {
        merge(pOut->off, xiON);
        merge(pOut->off, xjON);
    }
    // on spec
    pOut->on[0] = 0;
    if ((xiOFFSize+xjONSize) <= (xiONSize+xjOFFSize)) {
        merge(pOut->on, xiOFF);
        merge(pOut->on, xjON);
    } else {
        merge(pOut->on, xiON);
        merge(pOut->on, xjOFF);
    }
}